

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O2

char * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getString
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,
          ValueLength *length)

{
  byte bVar1;
  byte *pbVar2;
  Exception *this_00;
  ulong uVar3;
  long lVar4;
  
  pbVar2 = *(byte **)this;
  bVar1 = *pbVar2;
  if ((byte)(bVar1 - 0x40) < 0x7f) {
    uVar3 = (ulong)(bVar1 - 0x40);
    lVar4 = 1;
  }
  else {
    if (bVar1 != 0xbf) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      Exception::Exception(this_00,InvalidValueType,"Expecting type String");
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
    uVar3 = *(ulong *)(pbVar2 + 1);
    lVar4 = 9;
  }
  *length = uVar3;
  return (char *)(pbVar2 + lVar4);
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }